

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_peobj.c
# Opt level: O0

void emit_peobj_sym(BuildCtx *ctx,char *name,uint32_t value,int sect,int type,int scl)

{
  size_t __n;
  undefined4 in_EDX;
  char *in_RSI;
  size_t len;
  PEsym sym;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  
  __n = strlen(in_RSI);
  if (strtab == (char *)0x0) {
    if (8 < __n) {
      strtabofs = __n + 1 + strtabofs;
    }
  }
  else {
    if (__n < 9) {
      memcpy(&stack0xffffffffffffffcc,in_RSI,__n);
      memset(&stack0xffffffffffffffcc + __n,0,8 - __n);
    }
    else {
      in_stack_ffffffffffffffcc = 0;
      in_stack_ffffffffffffffd0 = (undefined4)strtabofs;
      memcpy(strtab + strtabofs,in_RSI,__n);
      strtab[strtabofs + __n] = '\0';
      strtabofs = __n + 1 + strtabofs;
    }
    owrite((BuildCtx *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0),
           (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),__n);
  }
  return;
}

Assistant:

static void emit_peobj_sym(BuildCtx *ctx, const char *name, uint32_t value,
			   int sect, int type, int scl)
{
  PEsym sym;
  size_t len = strlen(name);
  if (!strtab) {  /* Pass 1: only calculate string table length. */
    if (len > 8) strtabofs += len+1;
    return;
  }
  if (len <= 8) {
    memcpy(sym.n.name, name, len);
    memset(sym.n.name+len, 0, 8-len);
  } else {
    sym.n.nameref[0] = 0;
    sym.n.nameref[1] = (uint32_t)strtabofs;
    memcpy(strtab + strtabofs, name, len);
    strtab[strtabofs+len] = 0;
    strtabofs += len+1;
  }
  sym.value = value;
  sym.sect = (int16_t)(sect+1);  /* 1-based section number. */
  sym.type = (uint16_t)type;
  sym.scl = (uint8_t)scl;
  sym.naux = 0;
  owrite(ctx, &sym, PEOBJ_SYM_SIZE);
}